

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QSize __thiscall QAccessibleDisplay::imageSize(QAccessibleDisplay *this)

{
  QLabel *this_00;
  long in_FS_OFFSET;
  QLabel *label;
  QSize *in_stack_ffffffffffffffc0;
  QPixmap local_28 [24];
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAccessibleWidget::widget((QAccessibleWidget *)0x7ef675);
  this_00 = qobject_cast<QLabel*>((QObject *)0x7ef67d);
  if (this_00 == (QLabel *)0x0) {
    QSize::QSize(in_stack_ffffffffffffffc0);
  }
  else {
    QLabel::pixmap(this_00);
    local_10 = (QSize)QPixmap::size();
    QPixmap::~QPixmap(local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QAccessibleDisplay::imageSize() const
{
#if QT_CONFIG(label)
    QLabel *label = qobject_cast<QLabel *>(widget());
    if (!label)
#endif
        return QSize();
#if QT_CONFIG(label)
    return label->pixmap().size();
#endif
}